

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

sx__job_select_result sx__job_select(sx_job_context *ctx,uint32_t tid,uint32_t tags)

{
  sx_lock_t sVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  sx__job_select_result sVar4;
  sx_job_context *local_88;
  sx__job *node;
  int pr;
  int _i_182;
  uint32_t tags_local;
  uint32_t tid_local;
  sx_job_context *ctx_local;
  sx__job_select_result r;
  
  memset(&ctx_local,0,0x10);
  r._8_8_ = &ctx->job_lk;
  while( true ) {
    LOCK();
    sVar1 = *(sx_lock_t *)r._8_8_;
    *(sx_lock_t *)r._8_8_ = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (*(sx_lock_t *)r._8_8_ != 0);
  }
  bVar2 = false;
  uVar3 = extraout_RDX;
  do {
    if (bVar2) {
      sVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
      sVar4.waiting_list_alive = (_Bool)r.job._0_1_;
      sVar4.job = (sx__job *)ctx_local;
      return sVar4;
    }
    for (node._0_4_ = 0; (int)node < 3; node._0_4_ = (int)node + 1) {
      for (local_88 = (sx_job_context *)ctx->waiting_list[(int)node];
          local_88 != (sx_job_context *)0x0; local_88 = *(sx_job_context **)&local_88->field_0x68) {
        r.job._0_1_ = 1;
        if (((local_88->waiting_list[2]->job_index == 0) &&
            ((*(uint32_t *)&local_88->threads == 0 || (*(uint32_t *)&local_88->threads == tid)))) &&
           ((*(uint32_t *)((long)&local_88->threads + 4) == 0 ||
            ((*(uint32_t *)((long)&local_88->threads + 4) & tags) != 0)))) {
          ctx_local = local_88;
          sx__job_remove_list(ctx->waiting_list + (int)node,ctx->waiting_list_last + (int)node,
                              (sx__job *)local_88);
          node._0_4_ = 3;
          uVar3 = extraout_RDX_00;
          break;
        }
      }
    }
    bVar2 = true;
    ctx->job_lk = 0;
  } while( true );
}

Assistant:

static sx__job_select_result sx__job_select(sx_job_context* ctx, uint32_t tid, uint32_t tags)
{
    sx__job_select_result r = { 0 };
    
    sx_lock(ctx->job_lk) {
        for (int pr = 0; pr < SX_JOB_PRIORITY_COUNT; pr++) {
            sx__job* node = ctx->waiting_list[pr];
            while (node) {
                r.waiting_list_alive = true;
                if (*node->wait_counter == 0) {    // job must not be waiting/depend on any jobs
                    if ((node->owner_tid == 0 || node->owner_tid == tid) &&
                        (node->tags == 0 || (node->tags & tags))) {
                        r.job = node;
                        sx__job_remove_list(&ctx->waiting_list[pr], &ctx->waiting_list_last[pr], node);
                        pr = SX_JOB_PRIORITY_COUNT; // break out of the outer loop
                        break;
                    }
                }
                node = node->next;
            }    // while(iterate nodes)
        }        // foreach(priority)
    } // lock

    return r;
}